

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O3

void __thiscall
soul::Compiler::compileAllModules
          (Compiler *this,Namespace *parentNamespace,Program *program,ProcessorBase *processorToRun)

{
  ProcessorBase *pPVar1;
  ArrayView<soul::pool_ref<soul::Module>_> targetModules;
  pointer ppVar2;
  int iVar3;
  int index;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> sourceModules;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  soulModules;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> heartModules;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_88;
  char *local_68;
  char *local_60;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> local_58;
  ProcessorBase *local_40;
  pool_ref<soul::Module> local_38;
  
  local_88.
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pool_ref<soul::AST::ModuleBase> *)0x0;
  local_88.
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pool_ref<soul::AST::ModuleBase> *)0x0;
  local_88.
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = processorToRun;
  ASTUtilities::findAllModulesToCompile(parentNamespace,&local_88);
  local_58.
  super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pool_ref<soul::Module> *)0x0;
  local_58.
  super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pool_ref<soul::Module> *)0x0;
  local_58.
  super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::reserve
            (&local_58,
             (long)local_88.
                   super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.
                   super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar2 = local_88.
           super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_88.
           super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = "operator->";
    local_68 = "object != nullptr";
    ppVar4 = local_88.
             super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pPVar1 = (ProcessorBase *)ppVar4->object;
      bVar6 = pPVar1 != local_40;
      if (pPVar1 == (ProcessorBase *)0x0) {
        iVar3 = 0x3c;
LAB_001ab11f:
        throwInternalCompilerError(local_68,local_60,iVar3);
      }
      iVar3 = (*(pPVar1->super_ModuleBase).super_ASTObject._vptr_ASTObject[6])(pPVar1);
      index = -(uint)bVar6;
      if ((char)iVar3 == '\0') {
        iVar3 = (*(pPVar1->super_ModuleBase).super_ASTObject._vptr_ASTObject[5])(pPVar1);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(pPVar1->super_ModuleBase).super_ASTObject._vptr_ASTObject[4])(pPVar1);
          if ((char)iVar3 == '\0') {
            iVar3 = 0x124;
            local_68 = "module->isProcessor()";
            local_60 = "createHEARTModule";
            goto LAB_001ab11f;
          }
          local_38.object = Program::addProcessor(program,index);
        }
        else {
          local_38.object = Program::addGraph(program,index);
        }
      }
      else {
        local_38.object = Program::addNamespace(program,index);
      }
      std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>::
      emplace_back<soul::pool_ref<soul::Module>>
                ((vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>
                  *)&local_58,&local_38);
      ppVar4 = ppVar4 + 1;
      ppVar5 = local_88.
               super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (ppVar4 != ppVar2);
  }
  targetModules.e =
       local_58.
       super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  targetModules.s =
       local_58.
       super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  sourceModules.e = ppVar5;
  sourceModules.s =
       local_88.
       super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  HEARTGenerator::build(sourceModules,targetModules,0xff);
  if (local_58.
      super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pool_ref<soul::Module> *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.
      super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pool_ref<soul::AST::ModuleBase> *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Compiler::compileAllModules (const AST::Namespace& parentNamespace, Program& program,
                                  AST::ProcessorBase& processorToRun)
{
    std::vector<pool_ref<AST::ModuleBase>> soulModules;
    ASTUtilities::findAllModulesToCompile (parentNamespace, soulModules);

    std::vector<pool_ref<Module>> heartModules;
    heartModules.reserve (soulModules.size());

    for (auto& m : soulModules)
        heartModules.push_back (createHEARTModule (program, m, m == processorToRun));

    HEARTGenerator::build (soulModules, heartModules);
}